

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu.c
# Opt level: O0

RK_S32 VPUClientSendReg(int socket,RK_U32 *regs,RK_U32 nregs)

{
  int iVar1;
  undefined4 uVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_c8 [8];
  MppReqV1 reqs_tmp [2];
  VpuExtraInfo *extra_info;
  undefined4 local_88;
  RK_U32 reg_size;
  MppReqV1 reqs [3];
  RK_U32 *pRStack_38;
  RK_U32 i;
  VPUReq_t req;
  RK_S32 ret;
  int fd;
  RK_U32 nregs_local;
  RK_U32 *regs_local;
  int socket_local;
  
  if (vpu_debug != 0) {
    for (reqs[2].data_ptr._4_4_ = 0; reqs[2].data_ptr._4_4_ < nregs;
        reqs[2].data_ptr._4_4_ = reqs[2].data_ptr._4_4_ + 1) {
      _mpp_log_l(4,"vpu","set reg[%03d]: %08x\n",0,reqs[2].data_ptr._4_4_,
                 regs[reqs[2].data_ptr._4_4_]);
    }
  }
  if (ioctl_version < 1) {
    req.req._0_4_ = nregs << 2;
    pRStack_38 = regs;
    req._12_4_ = ioctl(socket,0x40086c03,&stack0xffffffffffffffc8);
  }
  else {
    reqs_tmp[1].data_ptr = (RK_U64)(regs + (nregs - 0xc));
    local_88 = 0x200;
    reqs[0].flag = 0;
    reqs[0].cmd = nregs << 2;
    reg_size = 1;
    reqs[0].data_ptr._0_4_ = 0x201;
    reqs[1].flag = 0;
    reqs[1].cmd = nregs << 2;
    reqs[0]._8_8_ = regs;
    reqs[1]._8_8_ = regs;
    if (((RK_U32 *)reqs_tmp[1].data_ptr == (RK_U32 *)0x0) ||
       (*(RK_U32 *)reqs_tmp[1].data_ptr != 0x4c4a46)) {
      reqs[0].data_ptr._4_4_ = 2;
      memcpy(local_c8,&local_88,0x30);
      req._12_4_ = ioctl(socket,0x40047601,local_c8);
    }
    else {
      reqs[1].data_ptr._0_4_ = 0x202;
      reqs[2].flag = 0;
      reqs[2].cmd = *(RK_U32 *)(reqs_tmp[1].data_ptr + 4) << 3;
      reqs[2]._8_8_ = reqs_tmp[1].data_ptr + 8;
      reqs[0].cmd = (nregs - 0xc) * 4;
      reqs[1].cmd = (nregs - 0xc) * 4;
      reqs[0].data_ptr._4_4_ = 1;
      reqs[1].data_ptr._4_4_ = 2;
      req._12_4_ = ioctl(socket,0x40047601,&local_88);
    }
  }
  uVar2 = req._12_4_;
  if (req._12_4_ != 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _mpp_log_l(2,"vpu","ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n","VPUClientSendReg",uVar2,
               iVar1,pcVar4);
  }
  return req._12_4_;
}

Assistant:

RK_S32 VPUClientSendReg(int socket, RK_U32 *regs, RK_U32 nregs)
{
    int fd = socket;
    RK_S32 ret;
    VPUReq_t req;

    if (vpu_debug) {
        RK_U32 i;

        for (i = 0; i < nregs; i++)
            mpp_log("set reg[%03d]: %08x\n", i, regs[i]);
    }

    if (ioctl_version > 0) {
        MppReqV1 reqs[3];
        RK_U32 reg_size = nregs;

        VpuExtraInfo *extra_info = (VpuExtraInfo*)(regs + (nregs - VPU_EXTRA_INFO_SIZE));

        reqs[0].cmd = MPP_CMD_SET_REG_WRITE;
        reqs[0].flag = 0;
        reqs[0].offset = 0;
        reqs[0].size =  reg_size * sizeof(RK_U32);
        reqs[0].data_ptr = REQ_DATA_PTR((void*)regs);
        reqs[0].flag |= VPU_MPP_FLAGS_MULTI_MSG;

        reqs[1].cmd = MPP_CMD_SET_REG_READ;
        reqs[1].flag = 0;
        reqs[1].offset = 0;
        reqs[1].size =  reg_size * sizeof(RK_U32);
        reqs[1].data_ptr = REQ_DATA_PTR((void*)regs);

        if (extra_info && extra_info->magic == VPU_EXTRA_INFO_MAGIC) {
            reg_size = nregs - VPU_EXTRA_INFO_SIZE;
            reqs[2].cmd = MPP_CMD_SET_REG_ADDR_OFFSET;
            reqs[2].flag = 0;
            reqs[2].offset = 0;
            reqs[2].size = extra_info->count * sizeof(extra_info->patchs[0]);
            reqs[2].data_ptr = REQ_DATA_PTR((void *)&extra_info->patchs[0]);

            reqs[0].size =  reg_size * sizeof(RK_U32);
            reqs[1].size =  reg_size * sizeof(RK_U32);
            reqs[1].flag |= VPU_MPP_FLAGS_MULTI_MSG;
            reqs[2].flag |= VPU_MPP_FLAGS_LAST_MSG;
            ret = (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &reqs);
        } else {
            MppReqV1 reqs_tmp[2];
            reqs[1].flag |= VPU_MPP_FLAGS_LAST_MSG;
            memcpy(reqs_tmp, reqs, sizeof(MppReqV1) * 2);
            ret = (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &reqs_tmp);
        }

    } else {
        nregs *= sizeof(RK_U32);
        req.req     = regs;
        req.size    = nregs;
        ret = (RK_S32)ioctl(fd, VPU_IOC_SET_REG, &req);
    }

    if (ret)
        mpp_err_f("ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n", ret, errno, strerror(errno));

    return ret;
}